

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.cpp
# Opt level: O2

void __thiscall
MergeTest_MergeCompareTime_Test_Test::TestBody(MergeTest_MergeCompareTime_Test_Test *this)

{
  int iVar1;
  int iVar2;
  HeapType HVar3;
  result_type rVar4;
  clock_t cVar5;
  clock_t cVar6;
  ostream *poVar7;
  int numHeap_1;
  char *in_R9;
  int elem;
  long lVar8;
  long lVar9;
  int numHeap;
  int iVar10;
  long lVar11;
  bool bVar12;
  vector<int,_std::allocator<int>_> values;
  AssertionResult gtest_ar_;
  FoolHeapList fool;
  HeapList tested;
  AssertHelper local_13e8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_13e0;
  string local_13d8;
  mt19937 generator;
  
  rVar4 = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&generator,rVar4);
  std::vector<int,_std::allocator<int>_>::vector(&values,1000000,(allocator_type *)&fool);
  for (lVar8 = 0; lVar8 != 1000000; lVar8 = lVar8 + 1) {
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&generator);
    values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar8] = (int)rVar4;
  }
  for (HVar3 = Binomial; HVar3 != Fool; HVar3 = HVar3 + Leftist) {
    fool.super_HeapList.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fool.super_HeapList.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    fool.super_HeapList.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    fool.super_HeapList.TYPE = Fool;
    HeapList::AddHeap(&fool.super_HeapList,
                      *values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start);
    tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    tested.TYPE = HVar3;
    for (lVar8 = 1; lVar8 != 1000000; lVar8 = lVar8 + 1) {
      (**(*fool.super_HeapList.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
           super__Vector_impl_data._M_start)->_vptr_IHeap)
                (*fool.super_HeapList.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
                 (ulong)(uint)values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar8]);
    }
    lVar8 = 0;
    for (lVar11 = 0; lVar11 != 1000; lVar11 = lVar11 + 1) {
      HeapList::AddHeap(&tested,values.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar11 * 1000]);
      for (lVar9 = 1; lVar9 != 1000; lVar9 = lVar9 + 1) {
        (**tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
           super__Vector_impl_data._M_start[lVar11]->_vptr_IHeap)
                  (tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11],
                   (ulong)*(uint *)((long)values.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start +
                                   lVar9 * 4 + lVar8));
      }
      lVar8 = lVar8 + 4000;
    }
    cVar5 = clock();
    for (lVar8 = 1; lVar8 != 1000; lVar8 = lVar8 + 1) {
      (*(*tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
          super__Vector_impl_data._M_start)->_vptr_IHeap[3])
                (*tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
                 tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8]);
      tested.list_.super__Vector_base<IHeap_*,_std::allocator<IHeap_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar8] = (IHeap *)0x0;
    }
    cVar6 = clock();
    poVar7 = std::operator<<((ostream *)&std::cout,"time of merging for heap of type ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,HVar3);
    std::operator<<(poVar7,' ');
    poVar7 = std::ostream::_M_insert<double>((double)(cVar6 - cVar5) / 1000000.0);
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar10 = 1000000;
    while (bVar12 = iVar10 != 0, iVar10 = iVar10 + -1, bVar12) {
      iVar1 = HeapList::ExtractMin(&fool.super_HeapList,0);
      iVar2 = HeapList::ExtractMin(&tested,0);
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar_.success_ = iVar1 == iVar2;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)&local_13e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_13d8,(internal *)&gtest_ar_,
                   (AssertionResult *)"fool.ExtractMin(0) == tested.ExtractMin(0)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_13e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/edgarshmavonyan[P]mergeable_heaps/unit_test.cpp"
                   ,0xa2,local_13d8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_13e8,(Message *)&local_13e0);
        testing::internal::AssertHelper::~AssertHelper(&local_13e8);
        std::__cxx11::string::~string((string *)&local_13d8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_13e0);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
    }
    HeapList::~HeapList(&tested);
    HeapList::~HeapList(&fool.super_HeapList);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&values.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(MergeTest, MergeCompareTime_Test) {
    // 1000 heaps with 1000 keys
    std::mt19937 generator(time(0));
    const size_t size = 1000, number = 1000;
    std::vector<int> values(number*size);
    for (int i = 0; i < size * number; i++) {
        values[i] = generator();
    }

    // in order to test binomial, skew and leftist we create 1 fool heap with size * number
    // keys as merging would be too slow
    // it does not change the correctness of the test

    for (int type = 0; type < 3; type++) {
        FoolHeapList fool;
        fool.AddHeap(values[0]);
        HeapList tested(type);

        for (int i = 0; i < size * number - 1; i++)
            fool.Insert(0, values[i + 1]);

        for (int numHeap = 0; numHeap < number; numHeap++) {
            tested.AddHeap(values[numHeap * 1000]);

            for (int elem = 1; elem < size; elem++)
                tested.Insert(numHeap, values[numHeap * 1000 + elem]);
        }

        clock_t t = clock();

        for (int numHeap = 1; numHeap < number; numHeap++) {
            tested.Meld(0, numHeap);
        }

        t = clock() - t;

        std::cout << "time of merging for heap of type " << type << ' ' << double(t) / CLOCKS_PER_SEC << std::endl;

        for (int i = 0; i < size * number; i++) {
            EXPECT_TRUE(fool.ExtractMin(0) == tested.ExtractMin(0));
        }
    }
}